

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_plastic.hpp
# Opt level: O0

void __thiscall RoughPlasticBSDF::RoughPlasticBSDF(RoughPlasticBSDF *this,Json *conf)

{
  undefined8 *in_RDI;
  float fVar1;
  vec3f vVar2;
  vec3f lambert_out;
  int i;
  double energy;
  int nsample;
  MT19937Sampler sampler;
  Sampler *in_stack_ffffffffffffec40;
  int in_stack_ffffffffffffec48;
  uint in_stack_ffffffffffffec4c;
  int iVar3;
  MT19937Sampler *in_stack_ffffffffffffec50;
  double dVar4;
  char *in_stack_ffffffffffffeca8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffecb0;
  Json *in_stack_ffffffffffffeec8;
  BSDF *in_stack_ffffffffffffeed0;
  
  BSDF::BSDF(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  *in_RDI = &PTR_f_001e8c08;
  vec3f::vec3f((vec3f *)(in_RDI + 6),1.0);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
  fVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator_float<float,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)0x19412f);
  *(float *)((long)in_RDI + 0x24) = fVar1;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
  fVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator_float<float,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)0x194154);
  *(float *)((long)in_RDI + 0x2c) = fVar1;
  MT19937Sampler::MT19937Sampler
            (in_stack_ffffffffffffec50,in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48);
  dVar4 = 0.0;
  for (iVar3 = 0; iVar3 < 1000000; iVar3 = iVar3 + 1) {
    vVar2 = Sampler::cosSampleHemisphereSurface(in_stack_ffffffffffffec40);
    in_stack_ffffffffffffec40 = vVar2._0_8_;
    fVar1 = DielectricBRDF::reflectivity(vVar2.y,vVar2.x);
    dVar4 = (double)(1.0 - fVar1) + dVar4;
  }
  *(float *)(in_RDI + 5) = (float)(dVar4 / 1000000.0);
  return;
}

Assistant:

RoughPlasticBSDF(const Json& conf): BSDF(conf)
	{
		IOR = conf["ior"];
		alpha = conf["roughness"];
		// precompute outRatio
		// here bruteforcing to demonstrate its physical meaning
		// you can optimize by using approximating polynormial
		MT19937Sampler sampler;
		const int nsample = 1000000;
		double energy = 0; // use double here because accumulating process introduces lots of rounding error
		for (int i=0; i<nsample; ++i) {
			vec3f lambert_out = sampler.cosSampleHemisphereSurface();
			energy += 1 - DielectricBRDF::reflectivity(lambert_out.z, 1/IOR);
		}
		outRatio = energy / nsample;
	}